

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

void WriteArrayVars(FSerializer *file,FWorldGlobalArray *vars,uint count,char *key)

{
  TMap<int,_int,_THashTraits<int>,_InitIntToZero> *this;
  uint uVar1;
  bool bVar2;
  hash_t hVar3;
  IPair *pIVar4;
  Pair *pair;
  IPair *pIVar5;
  uint uVar6;
  ulong uVar7;
  FWorldGlobalArray *pFVar8;
  ulong uVar9;
  FString arraykey;
  int v;
  FString local_58;
  FWorldGlobalArray *local_50;
  uint local_44;
  char *local_40;
  ulong local_38;
  
  if (count == 0) {
    return;
  }
  pIVar5 = (IPair *)(ulong)count;
  uVar7 = (ulong)count;
  uVar9 = 0;
  local_50 = vars;
  while (hVar3 = TMap<int,_int,_THashTraits<int>,_InitIntToZero>::CountUsed(vars), hVar3 == 0) {
    uVar9 = uVar9 + 1;
    vars = vars + 1;
    if (uVar7 == uVar9) {
      return;
    }
  }
  bVar2 = FSerializer::BeginObject(file,key);
  if (!bVar2) {
    return;
  }
  local_38 = uVar7;
  if (count <= (uint)uVar9) {
LAB_003ae97a:
    FSerializer::EndObject(file);
    return;
  }
  local_40 = FString::NullString.Nothing;
  pFVar8 = local_50;
LAB_003ae87b:
  this = pFVar8 + uVar9;
  hVar3 = TMap<int,_int,_THashTraits<int>,_InitIntToZero>::CountUsed(this);
  if (hVar3 != 0) {
    local_58.Chars = local_40;
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    FString::Format(&local_58,"%d",uVar9 & 0xffffffff);
    bVar2 = FSerializer::BeginObject(file,local_58.Chars);
    if (bVar2) {
      uVar7 = 0;
      do {
        uVar1 = this->Size;
        uVar6 = (uint)uVar7;
        if (uVar6 < uVar1) {
          pIVar4 = &this->Nodes[uVar7].Pair;
          do {
            uVar6 = uVar6 + 1;
            uVar7 = (ulong)uVar6;
            if (((Node *)(pIVar4 + -1))->Next != (Node *)0x1) {
              bVar2 = true;
              pIVar5 = pIVar4;
              goto LAB_003ae920;
            }
            pIVar4 = pIVar4 + 2;
          } while (uVar6 != uVar1);
          bVar2 = false;
          uVar7 = (ulong)uVar1;
        }
        else {
          bVar2 = false;
        }
LAB_003ae920:
        if (!bVar2) goto LAB_003ae957;
        FString::Format(&local_58,"%d",(ulong)(uint)pIVar5->Key);
        local_44 = pIVar5->Value;
        Serialize(file,local_58.Chars,(int32_t *)&local_44,(int32_t *)0x0);
      } while( true );
    }
    goto LAB_003ae964;
  }
  goto LAB_003ae96c;
LAB_003ae957:
  FSerializer::EndObject(file);
  pFVar8 = local_50;
LAB_003ae964:
  FString::~FString(&local_58);
LAB_003ae96c:
  uVar9 = uVar9 + 1;
  if (uVar9 == local_38) goto LAB_003ae97a;
  goto LAB_003ae87b;
}

Assistant:

static void WriteArrayVars (FSerializer &file, FWorldGlobalArray *vars, unsigned int count, const char *key)
{
	unsigned int i;

	// Find the first non-empty array.
	for (i = 0; i < count; ++i)
	{
		if (vars[i].CountUsed() != 0)
			break;
	}
	if (i < count)
	{
		if (file.BeginObject(key))
		{
			for(;i<count;i++)
			{
				if (vars[i].CountUsed())
				{
					FString arraykey;

					arraykey.Format("%d", i);
					if (file.BeginObject(arraykey))
					{
						FWorldGlobalArray::ConstIterator it(vars[i]);
						const FWorldGlobalArray::Pair *pair;

						while (it.NextPair(pair))
						{
							arraykey.Format("%d", pair->Key);
							int v = pair->Value;
							file(arraykey.GetChars(), v);
						}
						file.EndObject();
					}
				}
			}
			file.EndObject();
		}
	}
}